

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

void __thiscall tinyusdz::usda::USDAReader::Impl::Impl(Impl *this,StreamReader *sr)

{
  _Rb_tree_header *p_Var1;
  
  Stage::Stage(&this->_stage);
  ::std::
  stack<tinyusdz::usda::USDAReader::ParseState,std::deque<tinyusdz::usda::USDAReader::ParseState,std::allocator<tinyusdz::usda::USDAReader::ParseState>>>
  ::
  stack<std::deque<tinyusdz::usda::USDAReader::ParseState,std::allocator<tinyusdz::usda::USDAReader::ParseState>>,void>
            (&this->parse_stack);
  (this->_base_dir)._M_dataplus._M_p = (pointer)&(this->_base_dir).field_2;
  (this->_base_dir)._M_string_length = 0;
  (this->_base_dir).field_2._M_local_buf[0] = '\0';
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&this->_path_stack);
  (this->_err)._M_dataplus._M_p = (pointer)&(this->_err).field_2;
  (this->_err)._M_string_length = 0;
  (this->_err).field_2._M_local_buf[0] = '\0';
  (this->_warn)._M_dataplus._M_p = (pointer)&(this->_warn).field_2;
  (this->_warn)._M_string_length = 0;
  (this->_warn).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_reference_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_prim_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_prim_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_prim_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_primspec_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_primspec_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_toplevel_primspecs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_toplevel_primspecs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_toplevel_primspecs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_primspec_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_primspec_invalidated = false;
  (this->_defaultPrim)._M_dataplus._M_p = (pointer)&(this->_defaultPrim).field_2;
  (this->_defaultPrim)._M_string_length = 0;
  (this->_defaultPrim).field_2._M_local_buf[0] = '\0';
  (this->_config).allow_unknown_prims = true;
  (this->_config).allow_unknown_shader = true;
  (this->_config).allow_unknown_apiSchema = true;
  (this->_config).strict_allowedToken_check = false;
  ascii::AsciiParser::AsciiParser(&this->_parser);
  ascii::AsciiParser::SetStream(&this->_parser,sr);
  return;
}

Assistant:

Impl(StreamReader *sr) { _parser.SetStream(sr); }